

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O3

Grammar * xercesc_4_0::Grammar::loadGrammar(XSerializeEngine *serEng)

{
  undefined8 in_RAX;
  Grammar *pGVar1;
  size_t in_RCX;
  void *__buf;
  int __fd;
  int type;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  XSerializeEngine::operator>>(serEng,&local_14);
  if (local_14 == 0) {
    __fd = 0x438aa8;
  }
  else {
    if (local_14 != 1) {
      return (Grammar *)0x0;
    }
    __fd = 0x439a70;
  }
  pGVar1 = (Grammar *)XSerializeEngine::read(serEng,__fd,__buf,in_RCX);
  return pGVar1;
}

Assistant:

Grammar* Grammar::loadGrammar(XSerializeEngine& serEng)
{

    int type;
    serEng>>type;

    switch((GrammarType)type)
    {
    case DTDGrammarType: 
        DTDGrammar* dtdGrammar;
        serEng>>dtdGrammar;
        return dtdGrammar;
    case SchemaGrammarType:
        SchemaGrammar* schemaGrammar;
        serEng>>schemaGrammar;
        return schemaGrammar;        
    case UnKnown:
        return 0;        
    default: //we treat this same as UnKnown
        return 0;        
    }

}